

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O3

void __thiscall DCanvas::DrawTextureParms(DCanvas *this,FTexture *img,DrawParms *parms)

{
  double dVar1;
  double dVar2;
  double dVar3;
  byte bVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined2 uVar9;
  ESPSResult EVar10;
  FDynamicColormap *pFVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  fixed_t col;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  long lVar23;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar47;
  int iVar56;
  undefined1 auVar49 [16];
  int iVar48;
  int iVar57;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int iVar58;
  int iVar62;
  undefined1 in_XMM13 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar63;
  undefined1 auVar61 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar66 [16];
  
  uVar16 = parms->colorOverlay;
  if (uVar16 < 0x1000000) {
    if (parms->remap == (FRemapTable *)0x0) {
      swrenderer::drawerargs::dc_colormap = (BYTE *)0x0;
    }
    else {
      swrenderer::drawerargs::dc_colormap = parms->remap->Remap;
    }
  }
  else {
    bVar4 = (parms->style).field_0.Flags;
    uVar12 = bVar4 & 0x20;
    uVar13 = uVar12 >> 5 ^ 1;
    if ((bVar4 & 0x10) == 0) {
      uVar13 = uVar12;
    }
    if (uVar13 != 0) {
      uVar16 = uVar16 ^ 0xffffff;
      parms->colorOverlay = uVar16;
    }
    pFVar11 = GetSpecialLights((PalEntry)0xffffff,(PalEntry)(uVar16 & 0xffffff),0);
    swrenderer::drawerargs::dc_colormap =
         pFVar11->Maps + ((uint)*(byte *)((long)&parms->colorOverlay + 3) * 0x40420 >> 0xd & 0x3f00)
    ;
  }
  if (swrenderer::drawerargs::dc_colormap == (BYTE *)0x0) {
    swrenderer::drawerargs::dc_colormap = swrenderer::identitymap;
  }
  swrenderer::fixedcolormap = swrenderer::drawerargs::dc_colormap;
  EVar10 = swrenderer::R_SetPatchStyle(parms->style,parms->Alpha,0,parms->fillcolor);
  uVar7 = swrenderer::drawerargs::dc_destorg;
  swrenderer::drawerargs::dc_destorg = (screen->super_DSimpleCanvas).super_DCanvas.Buffer;
  if (swrenderer::drawerargs::dc_destorg == (BYTE *)0x0) {
    I_FatalError("Attempt to write to buffer of hardware canvas");
  }
  uVar8 = swrenderer::CenterY;
  if (EVar10 != DontDraw) {
    dVar29 = parms->x;
    dVar19 = parms->left;
    dVar18 = parms->destwidth;
    dVar1 = parms->texwidth;
    swrenderer::CenterY = 0;
    modf(parms->y - (parms->top * parms->destheight) / parms->texheight,&swrenderer::sprtopscreen);
    auVar6 = _DAT_005d6240;
    dVar2 = parms->destheight;
    swrenderer::spryscale = dVar2 / (double)img->Height;
    if (swrenderer::spryscale <= 0.0) {
      __assert_fail("spryscale > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0xcb,"virtual void DCanvas::DrawTextureParms(FTexture *, DrawParms &)");
    }
    swrenderer::sprflipvert = 0;
    swrenderer::drawerargs::dc_iscale = SUB84(1.0 / swrenderer::spryscale + 103079215104.0,0);
    swrenderer::dc_texturemid =
         (double)swrenderer::drawerargs::dc_iscale * (-1.0 - swrenderer::sprtopscreen) *
         1.52587890625e-05;
    uVar5 = img->Width;
    dVar3 = parms->destwidth;
    iVar15 = parms->dclip;
    if ((iVar15 != DrawTextureParms::bottomclipper[0]) &&
       (uVar14 = (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width, uVar14 != 0)) {
      lVar23 = uVar14 - 1;
      auVar20._8_4_ = (int)lVar23;
      auVar20._0_8_ = lVar23;
      auVar20._12_4_ = (int)((ulong)lVar23 >> 0x20);
      uVar17 = 0;
      auVar20 = auVar20 ^ _DAT_005d6240;
      auVar53._8_4_ = 0xffffffff;
      auVar53._0_8_ = 0xffffffffffffffff;
      auVar53._12_4_ = 0xffffffff;
      auVar39 = _DAT_005d6f50;
      auVar65 = _DAT_005d6f60;
      auVar66 = _DAT_005d6f70;
      auVar43 = _DAT_005d6230;
      do {
        auVar31 = auVar43 ^ auVar6;
        iVar48 = auVar20._0_4_;
        iVar47 = -(uint)(iVar48 < auVar31._0_4_);
        iVar58 = auVar20._4_4_;
        auVar32._4_4_ = -(uint)(iVar58 < auVar31._4_4_);
        iVar57 = auVar20._8_4_;
        iVar56 = -(uint)(iVar57 < auVar31._8_4_);
        iVar63 = auVar20._12_4_;
        auVar32._12_4_ = -(uint)(iVar63 < auVar31._12_4_);
        auVar37._4_4_ = iVar47;
        auVar37._0_4_ = iVar47;
        auVar37._8_4_ = iVar56;
        auVar37._12_4_ = iVar56;
        auVar59 = pshuflw(in_XMM13,auVar37,0xe8);
        auVar35._4_4_ = -(uint)(auVar31._4_4_ == iVar58);
        auVar35._12_4_ = -(uint)(auVar31._12_4_ == iVar63);
        auVar35._0_4_ = auVar35._4_4_;
        auVar35._8_4_ = auVar35._12_4_;
        auVar64 = pshuflw(in_XMM14,auVar35,0xe8);
        auVar32._0_4_ = auVar32._4_4_;
        auVar32._8_4_ = auVar32._12_4_;
        auVar31 = pshuflw(auVar59,auVar32,0xe8);
        auVar31 = (auVar31 | auVar64 & auVar59) ^ auVar53;
        auVar31 = packssdw(auVar31,auVar31);
        uVar9 = (undefined2)iVar15;
        if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)DrawTextureParms::bottomclipper + uVar17) = uVar9;
        }
        auVar32 = auVar35 & auVar37 | auVar32;
        auVar31 = packssdw(auVar32,auVar32);
        auVar31 = packssdw(auVar31 ^ auVar53,auVar31 ^ auVar53);
        if ((auVar31._0_4_ >> 0x10 & 1) != 0) {
          *(undefined2 *)((long)DrawTextureParms::bottomclipper + uVar17 + 2) = uVar9;
        }
        auVar35 = auVar66 ^ auVar6;
        iVar47 = -(uint)(iVar48 < auVar35._0_4_);
        auVar49._4_4_ = -(uint)(iVar58 < auVar35._4_4_);
        iVar56 = -(uint)(iVar57 < auVar35._8_4_);
        auVar49._12_4_ = -(uint)(iVar63 < auVar35._12_4_);
        auVar31._4_4_ = iVar47;
        auVar31._0_4_ = iVar47;
        auVar31._8_4_ = iVar56;
        auVar31._12_4_ = iVar56;
        auVar36._4_4_ = -(uint)(auVar35._4_4_ == iVar58);
        auVar36._12_4_ = -(uint)(auVar35._12_4_ == iVar63);
        auVar36._0_4_ = auVar36._4_4_;
        auVar36._8_4_ = auVar36._12_4_;
        auVar49._0_4_ = auVar49._4_4_;
        auVar49._8_4_ = auVar49._12_4_;
        auVar35 = auVar36 & auVar31 | auVar49;
        auVar35 = packssdw(auVar35,auVar35);
        auVar35 = packssdw(auVar35 ^ auVar53,auVar35 ^ auVar53);
        if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)DrawTextureParms::bottomclipper + uVar17 + 4) = uVar9;
        }
        auVar31 = pshufhw(auVar31,auVar31,0x84);
        auVar37 = pshufhw(auVar36,auVar36,0x84);
        auVar32 = pshufhw(auVar31,auVar49,0x84);
        auVar31 = (auVar32 | auVar37 & auVar31) ^ auVar53;
        auVar31 = packssdw(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)DrawTextureParms::bottomclipper + uVar17 + 6) = uVar9;
        }
        auVar31 = auVar65 ^ auVar6;
        iVar47 = -(uint)(iVar48 < auVar31._0_4_);
        auVar34._4_4_ = -(uint)(iVar58 < auVar31._4_4_);
        iVar56 = -(uint)(iVar57 < auVar31._8_4_);
        auVar34._12_4_ = -(uint)(iVar63 < auVar31._12_4_);
        auVar38._4_4_ = iVar47;
        auVar38._0_4_ = iVar47;
        auVar38._8_4_ = iVar56;
        auVar38._12_4_ = iVar56;
        auVar35 = pshuflw(auVar35,auVar38,0xe8);
        auVar33._4_4_ = -(uint)(auVar31._4_4_ == iVar58);
        auVar33._12_4_ = -(uint)(auVar31._12_4_ == iVar63);
        auVar33._0_4_ = auVar33._4_4_;
        auVar33._8_4_ = auVar33._12_4_;
        in_XMM14 = pshuflw(auVar64 & auVar59,auVar33,0xe8);
        in_XMM14 = in_XMM14 & auVar35;
        auVar34._0_4_ = auVar34._4_4_;
        auVar34._8_4_ = auVar34._12_4_;
        auVar31 = pshuflw(auVar35,auVar34,0xe8);
        auVar31 = (auVar31 | in_XMM14) ^ auVar53;
        auVar31 = packssdw(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)DrawTextureParms::bottomclipper + uVar17 + 8) = uVar9;
        }
        auVar34 = auVar33 & auVar38 | auVar34;
        auVar31 = packssdw(auVar34,auVar34);
        auVar31 = packssdw(auVar31 ^ auVar53,auVar31 ^ auVar53);
        if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)DrawTextureParms::bottomclipper + uVar17 + 10) = uVar9;
        }
        auVar31 = auVar39 ^ auVar6;
        iVar48 = -(uint)(iVar48 < auVar31._0_4_);
        auVar50._4_4_ = -(uint)(iVar58 < auVar31._4_4_);
        iVar57 = -(uint)(iVar57 < auVar31._8_4_);
        auVar50._12_4_ = -(uint)(iVar63 < auVar31._12_4_);
        auVar59._4_4_ = iVar48;
        auVar59._0_4_ = iVar48;
        auVar59._8_4_ = iVar57;
        auVar59._12_4_ = iVar57;
        auVar64._4_4_ = -(uint)(auVar31._4_4_ == iVar58);
        auVar64._12_4_ = -(uint)(auVar31._12_4_ == iVar63);
        auVar64._0_4_ = auVar64._4_4_;
        auVar64._8_4_ = auVar64._12_4_;
        auVar50._0_4_ = auVar50._4_4_;
        auVar50._8_4_ = auVar50._12_4_;
        auVar31 = auVar64 & auVar59 | auVar50;
        auVar31 = packssdw(auVar31,auVar31);
        in_XMM13 = packssdw(auVar31 ^ auVar53,auVar31 ^ auVar53);
        if ((in_XMM13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)DrawTextureParms::bottomclipper + uVar17 + 0xc) = uVar9;
        }
        auVar31 = pshufhw(auVar59,auVar59,0x84);
        auVar32 = pshufhw(auVar64,auVar64,0x84);
        auVar35 = pshufhw(auVar31,auVar50,0x84);
        auVar31 = (auVar35 | auVar32 & auVar31) ^ auVar53;
        auVar31 = packssdw(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)DrawTextureParms::bottomclipper + uVar17 + 0xe) = uVar9;
        }
        lVar23 = auVar43._8_8_;
        auVar43._0_8_ = auVar43._0_8_ + 8;
        auVar43._8_8_ = lVar23 + 8;
        lVar23 = auVar66._8_8_;
        auVar66._0_8_ = auVar66._0_8_ + 8;
        auVar66._8_8_ = lVar23 + 8;
        lVar23 = auVar65._8_8_;
        auVar65._0_8_ = auVar65._0_8_ + 8;
        auVar65._8_8_ = lVar23 + 8;
        lVar23 = auVar39._8_8_;
        auVar39._0_8_ = auVar39._0_8_ + 8;
        auVar39._8_8_ = lVar23 + 8;
        uVar17 = uVar17 + 0x10;
      } while ((uVar14 * 2 + 0xe & 0xfffffffffffffff0) != uVar17);
    }
    auVar6 = _DAT_005d6240;
    iVar48 = parms->uclip;
    if (iVar48 == 0) {
      swrenderer::mceilingclip = (short *)swrenderer::zeroarray;
    }
    else {
      swrenderer::mceilingclip = DrawTextureParms::topclipper;
      if ((iVar48 != DrawTextureParms::topclipper[0]) &&
         (uVar14 = (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width, uVar14 != 0)) {
        lVar23 = uVar14 - 1;
        auVar22._8_4_ = (int)lVar23;
        auVar22._0_8_ = lVar23;
        auVar22._12_4_ = (int)((ulong)lVar23 >> 0x20);
        uVar17 = 0;
        auVar22 = auVar22 ^ _DAT_005d6240;
        auVar30._8_4_ = 0xffffffff;
        auVar30._0_8_ = 0xffffffffffffffff;
        auVar30._12_4_ = 0xffffffff;
        swrenderer::mceilingclip = DrawTextureParms::topclipper;
        auVar24 = _DAT_005d6f50;
        auVar26 = _DAT_005d6f60;
        auVar27 = _DAT_005d6f70;
        auVar28 = _DAT_005d6230;
        do {
          auVar39 = auVar28 ^ auVar6;
          iVar58 = auVar22._0_4_;
          iVar56 = -(uint)(iVar58 < auVar39._0_4_);
          iVar57 = auVar22._4_4_;
          auVar41._4_4_ = -(uint)(iVar57 < auVar39._4_4_);
          iVar63 = auVar22._8_4_;
          iVar62 = -(uint)(iVar63 < auVar39._8_4_);
          iVar47 = auVar22._12_4_;
          auVar41._12_4_ = -(uint)(iVar47 < auVar39._12_4_);
          auVar51._4_4_ = iVar56;
          auVar51._0_4_ = iVar56;
          auVar51._8_4_ = iVar62;
          auVar51._12_4_ = iVar62;
          auVar65 = pshuflw(in_XMM14,auVar51,0xe8);
          auVar40._4_4_ = -(uint)(auVar39._4_4_ == iVar57);
          auVar40._12_4_ = -(uint)(auVar39._12_4_ == iVar47);
          auVar40._0_4_ = auVar40._4_4_;
          auVar40._8_4_ = auVar40._12_4_;
          auVar66 = pshuflw(in_XMM15,auVar40,0xe8);
          auVar41._0_4_ = auVar41._4_4_;
          auVar41._8_4_ = auVar41._12_4_;
          auVar39 = pshuflw(auVar65,auVar41,0xe8);
          auVar39 = (auVar39 | auVar66 & auVar65) ^ auVar30;
          auVar39 = packssdw(auVar39,auVar39);
          uVar9 = (undefined2)iVar48;
          if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)DrawTextureParms::topclipper + uVar17) = uVar9;
          }
          auVar41 = auVar40 & auVar51 | auVar41;
          auVar39 = packssdw(auVar41,auVar41);
          auVar39 = packssdw(auVar39 ^ auVar30,auVar39 ^ auVar30);
          if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)((long)DrawTextureParms::topclipper + uVar17 + 2) = uVar9;
          }
          auVar39 = auVar27 ^ auVar6;
          iVar56 = -(uint)(iVar58 < auVar39._0_4_);
          auVar60._4_4_ = -(uint)(iVar57 < auVar39._4_4_);
          iVar62 = -(uint)(iVar63 < auVar39._8_4_);
          auVar60._12_4_ = -(uint)(iVar47 < auVar39._12_4_);
          auVar42._4_4_ = iVar56;
          auVar42._0_4_ = iVar56;
          auVar42._8_4_ = iVar62;
          auVar42._12_4_ = iVar62;
          auVar52._4_4_ = -(uint)(auVar39._4_4_ == iVar57);
          auVar52._12_4_ = -(uint)(auVar39._12_4_ == iVar47);
          auVar52._0_4_ = auVar52._4_4_;
          auVar52._8_4_ = auVar52._12_4_;
          auVar60._0_4_ = auVar60._4_4_;
          auVar60._8_4_ = auVar60._12_4_;
          auVar39 = auVar52 & auVar42 | auVar60;
          auVar39 = packssdw(auVar39,auVar39);
          auVar39 = packssdw(auVar39 ^ auVar30,auVar39 ^ auVar30);
          if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)DrawTextureParms::topclipper + uVar17 + 4) = uVar9;
          }
          auVar43 = pshufhw(auVar42,auVar42,0x84);
          auVar53 = pshufhw(auVar52,auVar52,0x84);
          auVar20 = pshufhw(auVar43,auVar60,0x84);
          auVar43 = (auVar20 | auVar53 & auVar43) ^ auVar30;
          auVar43 = packssdw(auVar43,auVar43);
          if ((auVar43 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)DrawTextureParms::topclipper + uVar17 + 6) = uVar9;
          }
          auVar43 = auVar26 ^ auVar6;
          iVar56 = -(uint)(iVar58 < auVar43._0_4_);
          auVar45._4_4_ = -(uint)(iVar57 < auVar43._4_4_);
          iVar62 = -(uint)(iVar63 < auVar43._8_4_);
          auVar45._12_4_ = -(uint)(iVar47 < auVar43._12_4_);
          auVar54._4_4_ = iVar56;
          auVar54._0_4_ = iVar56;
          auVar54._8_4_ = iVar62;
          auVar54._12_4_ = iVar62;
          auVar39 = pshuflw(auVar39,auVar54,0xe8);
          auVar44._4_4_ = -(uint)(auVar43._4_4_ == iVar57);
          auVar44._12_4_ = -(uint)(auVar43._12_4_ == iVar47);
          auVar44._0_4_ = auVar44._4_4_;
          auVar44._8_4_ = auVar44._12_4_;
          in_XMM15 = pshuflw(auVar66 & auVar65,auVar44,0xe8);
          in_XMM15 = in_XMM15 & auVar39;
          auVar45._0_4_ = auVar45._4_4_;
          auVar45._8_4_ = auVar45._12_4_;
          auVar39 = pshuflw(auVar39,auVar45,0xe8);
          auVar39 = (auVar39 | in_XMM15) ^ auVar30;
          auVar39 = packssdw(auVar39,auVar39);
          if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)DrawTextureParms::topclipper + uVar17 + 8) = uVar9;
          }
          auVar45 = auVar44 & auVar54 | auVar45;
          auVar39 = packssdw(auVar45,auVar45);
          auVar39 = packssdw(auVar39 ^ auVar30,auVar39 ^ auVar30);
          if ((auVar39 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)DrawTextureParms::topclipper + uVar17 + 10) = uVar9;
          }
          auVar39 = auVar24 ^ auVar6;
          iVar58 = -(uint)(iVar58 < auVar39._0_4_);
          auVar61._4_4_ = -(uint)(iVar57 < auVar39._4_4_);
          iVar63 = -(uint)(iVar63 < auVar39._8_4_);
          auVar61._12_4_ = -(uint)(iVar47 < auVar39._12_4_);
          auVar46._4_4_ = iVar58;
          auVar46._0_4_ = iVar58;
          auVar46._8_4_ = iVar63;
          auVar46._12_4_ = iVar63;
          auVar55._4_4_ = -(uint)(auVar39._4_4_ == iVar57);
          auVar55._12_4_ = -(uint)(auVar39._12_4_ == iVar47);
          auVar55._0_4_ = auVar55._4_4_;
          auVar55._8_4_ = auVar55._12_4_;
          auVar61._0_4_ = auVar61._4_4_;
          auVar61._8_4_ = auVar61._12_4_;
          auVar39 = auVar55 & auVar46 | auVar61;
          auVar39 = packssdw(auVar39,auVar39);
          in_XMM14 = packssdw(auVar39 ^ auVar30,auVar39 ^ auVar30);
          if ((in_XMM14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)DrawTextureParms::topclipper + uVar17 + 0xc) = uVar9;
          }
          auVar39 = pshufhw(auVar46,auVar46,0x84);
          auVar66 = pshufhw(auVar55,auVar55,0x84);
          auVar65 = pshufhw(auVar39,auVar61,0x84);
          auVar39 = (auVar65 | auVar66 & auVar39) ^ auVar30;
          auVar39 = packssdw(auVar39,auVar39);
          if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)DrawTextureParms::topclipper + uVar17 + 0xe) = uVar9;
          }
          lVar23 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 8;
          auVar28._8_8_ = lVar23 + 8;
          lVar23 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 8;
          auVar27._8_8_ = lVar23 + 8;
          lVar23 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 8;
          auVar26._8_8_ = lVar23 + 8;
          lVar23 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 8;
          auVar24._8_8_ = lVar23 + 8;
          uVar17 = uVar17 + 0x10;
        } while ((uVar14 * 2 + 0xe & 0xfffffffffffffff0) != uVar17);
      }
    }
    dVar29 = dVar29 - (dVar19 * dVar18) / dVar1;
    dVar19 = (double)uVar5 / dVar3;
    swrenderer::mfloorclip = DrawTextureParms::bottomclipper;
    if (parms->flipX == 0) {
      col = 0;
    }
    else {
      col = *(int *)&img->Width * 0x10000 + -1;
      dVar19 = -dVar19;
    }
    dVar21 = dVar29 + dVar3;
    dVar18 = parms->texwidth;
    dVar1 = parms->windowleft;
    dVar25 = parms->windowright;
    if ((0.0 < dVar1) || (dVar25 < dVar18)) {
      if (dVar18 <= dVar25) {
        dVar25 = dVar18;
      }
      dVar29 = dVar29 + dVar1 * (dVar3 / dVar18);
      col = col + SUB84(dVar1 + 103079215104.0,0);
      dVar21 = dVar21 - (dVar18 - dVar25) * (dVar3 / dVar18);
    }
    dVar18 = (double)parms->lclip;
    if (dVar29 < dVar18) {
      col = col + SUB84((dVar18 - dVar29) * dVar19 + 103079215104.0,0);
      dVar29 = dVar18;
    }
    dVar18 = (double)parms->rclip;
    if (dVar21 <= (double)parms->rclip) {
      dVar18 = dVar21;
    }
    uVar13 = (uint)dVar18;
    swrenderer::drawerargs::dc_x = (uint)dVar29;
    uVar16 = uVar13 & 0xfffffffc;
    if (iVar15 - iVar48 < 0x20) {
      uVar16 = swrenderer::drawerargs::dc_x;
    }
    if (dVar2 < 32.0) {
      uVar16 = swrenderer::drawerargs::dc_x;
    }
    if (EVar10 == DoDraw0) {
      uVar16 = swrenderer::drawerargs::dc_x;
    }
    if ((int)swrenderer::drawerargs::dc_x < (int)uVar13) {
      iVar15 = SUB84(dVar19 + 103079215104.0,0);
      for (; ((int)swrenderer::drawerargs::dc_x < (int)uVar16 &&
             ((swrenderer::drawerargs::dc_x & 3) != 0));
          swrenderer::drawerargs::dc_x = swrenderer::drawerargs::dc_x + 1) {
        swrenderer::R_DrawMaskedColumn(img,col,false,parms->masked == 0);
        col = col + iVar15;
      }
      while ((int)swrenderer::drawerargs::dc_x < (int)uVar16) {
        swrenderer::rt_initcols((uint8_t *)0x48bc51);
        iVar48 = -4;
        uVar12 = swrenderer::drawerargs::dc_x;
        do {
          swrenderer::drawerargs::dc_x = uVar12;
          swrenderer::R_DrawMaskedColumn(img,col,true,parms->masked == 0);
          col = col + iVar15;
          iVar48 = iVar48 + 1;
          uVar12 = swrenderer::drawerargs::dc_x + 1;
        } while (iVar48 != 0);
        iVar48 = swrenderer::drawerargs::dc_x - 3;
        swrenderer::drawerargs::dc_x = swrenderer::drawerargs::dc_x + 1;
        swrenderer::rt_draw4cols(iVar48);
      }
      for (; (int)swrenderer::drawerargs::dc_x < (int)uVar13;
          swrenderer::drawerargs::dc_x = swrenderer::drawerargs::dc_x + 1) {
        swrenderer::R_DrawMaskedColumn(img,col,false,parms->masked == 0);
        col = col + iVar15;
      }
    }
  }
  swrenderer::CenterY = uVar8;
  swrenderer::R_FinishSetPatchStyle();
  swrenderer::drawerargs::dc_destorg = (BYTE *)uVar7;
  if ((ticdup != 0) && (menuactive == MENU_Off)) {
    NetUpdate();
    return;
  }
  return;
}

Assistant:

void DCanvas::DrawTextureParms(FTexture *img, DrawParms &parms)
{
#ifndef NO_SWRENDER
	using namespace swrenderer;
	using namespace drawerargs;

	static short bottomclipper[MAXWIDTH], topclipper[MAXWIDTH];
	const BYTE *translation = NULL;

	if (APART(parms.colorOverlay) != 0)
	{
		// The software renderer cannot invert the source without inverting the overlay
		// too. That means if the source is inverted, we need to do the reverse of what
		// the invert overlay flag says to do.
		INTBOOL invertoverlay = (parms.style.Flags & STYLEF_InvertOverlay);

		if (parms.style.Flags & STYLEF_InvertSource)
		{
			invertoverlay = !invertoverlay;
		}
		if (invertoverlay)
		{
			parms.colorOverlay = PalEntry(parms.colorOverlay).InverseColor();
		}
		// Note that this overrides DTA_Translation in software, but not in hardware.
		FDynamicColormap *colormap = GetSpecialLights(MAKERGB(255,255,255),
			parms.colorOverlay & MAKEARGB(0,255,255,255), 0);
		translation = &colormap->Maps[(APART(parms.colorOverlay)*NUMCOLORMAPS/255)*256];
	}
	else if (parms.remap != NULL)
	{
		translation = parms.remap->Remap;
	}

	if (translation != NULL)
	{
		dc_colormap = (lighttable_t *)translation;
	}
	else
	{
		dc_colormap = identitymap;
	}

	fixedcolormap = dc_colormap;
	ESPSResult mode = R_SetPatchStyle (parms.style, parms.Alpha, 0, parms.fillcolor);

	BYTE *destorgsave = dc_destorg;
	dc_destorg = screen->GetBuffer();
	if (dc_destorg == NULL)
	{
		I_FatalError("Attempt to write to buffer of hardware canvas");
	}

	double x0 = parms.x - parms.left * parms.destwidth / parms.texwidth;
	double y0 = parms.y - parms.top * parms.destheight / parms.texheight;

	if (mode != DontDraw)
	{
		int stop4;

		double centeryback = CenterY;
		CenterY = 0;

		// There is not enough precision in the drawing routines to keep the full
		// precision for y0. :(
		modf(y0, &sprtopscreen);

		double yscale = parms.destheight / img->GetHeight();
		double iyscale = 1 / yscale;

		spryscale = yscale;
		assert(spryscale > 0);

		sprflipvert = false;
		//dc_iscale = FLOAT2FIXED(iyscale);
		//dc_texturemid = (-y0) * iyscale;
		//dc_iscale = 0xffffffffu / (unsigned)spryscale;
		dc_iscale = FLOAT2FIXED(1 / spryscale);
		dc_texturemid = (CenterY - 1 - sprtopscreen) * dc_iscale / 65536;
		fixed_t frac = 0;
		double xiscale = img->GetWidth() / parms.destwidth;
		double x2 = x0 + parms.destwidth;

		if (bottomclipper[0] != parms.dclip)
		{
			fillshort(bottomclipper, screen->GetWidth(), (short)parms.dclip);
		}
		if (parms.uclip != 0)
		{
			if (topclipper[0] != parms.uclip)
			{
				fillshort(topclipper, screen->GetWidth(), (short)parms.uclip);
			}
			mceilingclip = topclipper;
		}
		else
		{
			mceilingclip = zeroarray;
		}
		mfloorclip = bottomclipper;

		if (parms.flipX)
		{
			frac = (img->GetWidth() << FRACBITS) - 1;
			xiscale = -xiscale;
		}

		if (parms.windowleft > 0 || parms.windowright < parms.texwidth)
		{
			double wi = MIN(parms.windowright, parms.texwidth);
			double xscale = parms.destwidth / parms.texwidth;
			x0 += parms.windowleft * xscale;
			frac += FLOAT2FIXED(parms.windowleft);
			x2 -= (parms.texwidth - wi) * xscale;
		}
		if (x0 < parms.lclip)
		{
			frac += FLOAT2FIXED((parms.lclip - x0) * xiscale);
			x0 = parms.lclip;
		}
		if (x2 > parms.rclip)
		{
			x2 = parms.rclip;
		}

		// Drawing short output ought to fit in the data cache well enough
		// if we draw one column at a time, so do that, since it's simpler.
		if (parms.destheight < 32 || (parms.dclip - parms.uclip) < 32)
		{
			mode = DoDraw0;
		}

		dc_x = int(x0);
		int x2_i = int(x2);
		fixed_t xiscale_i = FLOAT2FIXED(xiscale);

		if (mode == DoDraw0)
		{
			// One column at a time
			stop4 = dc_x;
		}
		else	 // DoDraw1`
		{
			// Up to four columns at a time
			stop4 = x2_i & ~3;
		}

		if (dc_x < x2_i)
		{
			while ((dc_x < stop4) && (dc_x & 3))
			{
				R_DrawMaskedColumn(img, frac, false, !parms.masked);
				dc_x++;
				frac += xiscale_i;
			}

			while (dc_x < stop4)
			{
				rt_initcols();
				for (int zz = 4; zz; --zz)
				{
					R_DrawMaskedColumn(img, frac, true, !parms.masked);
					dc_x++;
					frac += xiscale_i;
				}
				rt_draw4cols(dc_x - 4);
			}

			while (dc_x < x2_i)
			{
				R_DrawMaskedColumn(img, frac, false, !parms.masked);
				dc_x++;
				frac += xiscale_i;
			}
		}
		CenterY = centeryback;
	}
	R_FinishSetPatchStyle ();

	dc_destorg = destorgsave;

	if (ticdup != 0 && menuactive == MENU_Off)
	{
		NetUpdate();
	}
#endif
}